

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdh(secp256k1_context *ctx,uchar *output,secp256k1_pubkey *point,uchar *scalar,
                  secp256k1_ecdh_hash_function hashfp,void *data)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  code *in_R8;
  undefined8 in_R9;
  uchar y [32];
  uchar x [32];
  secp256k1_scalar s;
  secp256k1_ge pt;
  secp256k1_gej res;
  int overflow;
  int ret;
  secp256k1_scalar *in_stack_000002f0;
  secp256k1_ge *in_stack_000002f8;
  secp256k1_gej *in_stack_00000300;
  secp256k1_fe *in_stack_fffffffffffffe78;
  secp256k1_ge *in_stack_fffffffffffffe80;
  secp256k1_context *in_stack_fffffffffffffe88;
  secp256k1_scalar *in_stack_fffffffffffffe90;
  undefined1 local_168 [32];
  size_t in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  secp256k1_scalar *in_stack_fffffffffffffec8;
  secp256k1_scalar *in_stack_fffffffffffffed0;
  secp256k1_gej *in_stack_fffffffffffffed8;
  secp256k1_ge *in_stack_fffffffffffffee0;
  code *local_30;
  uint local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ecdh/main_impl.h"
            ,0x27,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    local_4 = 0;
  }
  else {
    local_30 = in_R8;
    if (in_R8 == (code *)0x0) {
      local_30 = ecdh_hash_function_sha256;
    }
    secp256k1_pubkey_load
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (secp256k1_pubkey *)in_stack_fffffffffffffe78);
    secp256k1_scalar_set_b32
              (in_stack_fffffffffffffe90,(uchar *)in_stack_fffffffffffffe88,
               (int *)in_stack_fffffffffffffe80);
    iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x106132);
    secp256k1_scalar_cmov
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
    secp256k1_ecmult_const(in_stack_00000300,in_stack_000002f8,in_stack_000002f0);
    secp256k1_ge_set_gej(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    secp256k1_fe_normalize((secp256k1_fe *)0x10618b);
    secp256k1_fe_normalize((secp256k1_fe *)0x106199);
    secp256k1_fe_get_b32((uchar *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    secp256k1_fe_get_b32((uchar *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    iVar2 = (*local_30)(in_RSI,local_168,&stack0xfffffffffffffe78,in_R9);
    secp256k1_memclear((void *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       in_stack_fffffffffffffeb8);
    secp256k1_memclear((void *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       in_stack_fffffffffffffeb8);
    secp256k1_scalar_clear((secp256k1_scalar *)0x106208);
    secp256k1_ge_clear((secp256k1_ge *)0x106212);
    secp256k1_gej_clear((secp256k1_gej *)0x10621f);
    local_4 = (uint)(iVar2 != 0 & (iVar1 != 0 ^ 0xffU) & 1);
  }
  return local_4;
}

Assistant:

int secp256k1_ecdh(const secp256k1_context* ctx, unsigned char *output, const secp256k1_pubkey *point, const unsigned char *scalar, secp256k1_ecdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow = 0;
    secp256k1_gej res;
    secp256k1_ge pt;
    secp256k1_scalar s;
    unsigned char x[32];
    unsigned char y[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(point != NULL);
    ARG_CHECK(scalar != NULL);

    if (hashfp == NULL) {
        hashfp = secp256k1_ecdh_hash_function_default;
    }

    secp256k1_pubkey_load(ctx, &pt, point);
    secp256k1_scalar_set_b32(&s, scalar, &overflow);

    overflow |= secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    secp256k1_ecmult_const(&res, &pt, &s);
    secp256k1_ge_set_gej(&pt, &res);

    /* Compute a hash of the point */
    secp256k1_fe_normalize(&pt.x);
    secp256k1_fe_normalize(&pt.y);
    secp256k1_fe_get_b32(x, &pt.x);
    secp256k1_fe_get_b32(y, &pt.y);

    ret = hashfp(output, x, y, data);

    secp256k1_memclear(x, sizeof(x));
    secp256k1_memclear(y, sizeof(y));
    secp256k1_scalar_clear(&s);
    secp256k1_ge_clear(&pt);
    secp256k1_gej_clear(&res);

    return !!ret & !overflow;
}